

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t COVER_ctx_init(COVER_ctx_t *ctx,void *samplesBuffer,size_t *samplesSizes,uint nbSamples,
                     uint d,double splitPoint)

{
  uint uVar1;
  _func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *p_Var2;
  _func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *cmp;
  _func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *grp;
  U32 *pUVar3;
  size_t *psVar4;
  uint in_ECX;
  code *__compar;
  size_t *in_RDX;
  BYTE *in_RSI;
  COVER_ctx_t *in_RDI;
  uint in_R8D;
  double in_XMM0_Qa;
  U32 i_1;
  U32 i;
  size_t testSamplesSize;
  size_t trainingSamplesSize;
  uint nbTestSamples;
  uint nbTrainSamples;
  size_t totalSamplesSize;
  BYTE *samples;
  ulong local_98;
  _func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *local_88;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  _func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *data;
  size_t local_8;
  
  p_Var2 = (_func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *)COVER_sum(in_RDX,in_ECX);
  grp = p_Var2;
  cmp = p_Var2;
  uVar5 = in_ECX;
  uVar6 = in_ECX;
  data = p_Var2;
  uVar1 = in_ECX;
  uVar7 = in_ECX;
  if (in_XMM0_Qa < 1.0) {
    uVar7 = (uint)(long)((double)in_ECX * in_XMM0_Qa);
    uVar1 = in_ECX - uVar7;
    uVar5 = uVar1;
    uVar6 = uVar7;
    cmp = (_func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *)COVER_sum(in_RDX,uVar7);
    data = cmp;
    grp = (_func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *)
          COVER_sum(in_RDX + ((long)((double)in_ECX * in_XMM0_Qa) & 0xffffffff),uVar1);
  }
  if (in_R8D < 9) {
    local_88 = (_func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *)0x8;
  }
  else {
    local_88 = (_func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *)(ulong)in_R8D;
  }
  if ((p_Var2 < local_88) || ((_func_int_COVER_ctx_t_ptr_void_ptr_void_ptr *)0xfffffffe < p_Var2)) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Total samples size is too large (%u MB), maximum size is %u MB\n",
              (ulong)p_Var2 >> 0x14 & 0xffffffff,0xfff);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (uVar7 < 5) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Total number of training samples is %u and is invalid.",(ulong)uVar7);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else if (uVar1 == 0) {
    if (0 < g_displayLevel) {
      fprintf(_stderr,"Total number of testing samples is %u and is invalid.",0);
      fflush(_stderr);
    }
    local_8 = 0xffffffffffffffb8;
  }
  else {
    p_Var2 = grp;
    memset(in_RDI,0,0x58);
    if (1 < g_displayLevel) {
      fprintf(_stderr,"Training on %u samples of total size %u\n",(ulong)uVar7,
              (ulong)data & 0xffffffff);
      fflush(_stderr);
    }
    if (1 < g_displayLevel) {
      fprintf(_stderr,"Testing on %u samples of total size %u\n",(ulong)uVar1,
              (ulong)p_Var2 & 0xffffffff);
      fflush(_stderr);
    }
    in_RDI->samples = in_RSI;
    in_RDI->samplesSizes = in_RDX;
    in_RDI->nbSamples = (ulong)in_ECX;
    in_RDI->nbTrainSamples = (ulong)uVar7;
    in_RDI->nbTestSamples = (ulong)uVar1;
    if (in_R8D < 9) {
      local_98 = 8;
    }
    else {
      local_98 = (ulong)in_R8D;
    }
    in_RDI->suffixSize = (size_t)(data + (1 - local_98));
    pUVar3 = (U32 *)malloc(in_RDI->suffixSize << 2);
    in_RDI->suffix = pUVar3;
    pUVar3 = (U32 *)malloc(in_RDI->suffixSize << 2);
    in_RDI->dmerAt = pUVar3;
    psVar4 = (size_t *)malloc((ulong)(in_ECX + 1) << 3);
    in_RDI->offsets = psVar4;
    if (((in_RDI->suffix == (U32 *)0x0) || (in_RDI->dmerAt == (U32 *)0x0)) ||
       (in_RDI->offsets == (size_t *)0x0)) {
      if (0 < g_displayLevel) {
        fprintf(_stderr,"Failed to allocate scratch buffers\n");
        fflush(_stderr);
      }
      COVER_ctx_destroy((COVER_ctx_t *)0x29143e);
      local_8 = 0xffffffffffffffc0;
    }
    else {
      in_RDI->freqs = (U32 *)0x0;
      in_RDI->d = in_R8D;
      *in_RDI->offsets = 0;
      for (uVar1 = 1; uVar1 <= in_ECX; uVar1 = uVar1 + 1) {
        in_RDI->offsets[uVar1] = in_RDI->offsets[uVar1 - 1] + in_RDX[uVar1 - 1];
      }
      if (1 < g_displayLevel) {
        fprintf(_stderr,"Constructing partial suffix array\n");
        fflush(_stderr);
      }
      for (uVar7 = 0; (ulong)uVar7 < in_RDI->suffixSize; uVar7 = uVar7 + 1) {
        in_RDI->suffix[uVar7] = uVar7;
      }
      __compar = COVER_strict_cmp;
      if (in_RDI->d < 9) {
        __compar = COVER_strict_cmp8;
      }
      g_coverCtx = in_RDI;
      qsort(in_RDI->suffix,in_RDI->suffixSize,4,__compar);
      if (1 < g_displayLevel) {
        fprintf(_stderr,"Computing frequencies\n");
        fflush(_stderr);
      }
      COVER_groupBy(data,(size_t)p_Var2,CONCAT44(uVar1,uVar7),(COVER_ctx_t *)CONCAT44(uVar6,uVar5),
                    cmp,(_func_void_COVER_ctx_t_ptr_void_ptr_void_ptr *)grp);
      in_RDI->freqs = in_RDI->suffix;
      in_RDI->suffix = (U32 *)0x0;
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static size_t COVER_ctx_init(COVER_ctx_t *ctx, const void *samplesBuffer,
                          const size_t *samplesSizes, unsigned nbSamples,
                          unsigned d, double splitPoint) {
  const BYTE *const samples = (const BYTE *)samplesBuffer;
  const size_t totalSamplesSize = COVER_sum(samplesSizes, nbSamples);
  /* Split samples into testing and training sets */
  const unsigned nbTrainSamples = splitPoint < 1.0 ? (unsigned)((double)nbSamples * splitPoint) : nbSamples;
  const unsigned nbTestSamples = splitPoint < 1.0 ? nbSamples - nbTrainSamples : nbSamples;
  const size_t trainingSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes, nbTrainSamples) : totalSamplesSize;
  const size_t testSamplesSize = splitPoint < 1.0 ? COVER_sum(samplesSizes + nbTrainSamples, nbTestSamples) : totalSamplesSize;
  /* Checks */
  if (totalSamplesSize < MAX(d, sizeof(U64)) ||
      totalSamplesSize >= (size_t)COVER_MAX_SAMPLES_SIZE) {
    DISPLAYLEVEL(1, "Total samples size is too large (%u MB), maximum size is %u MB\n",
                 (unsigned)(totalSamplesSize>>20), (COVER_MAX_SAMPLES_SIZE >> 20));
    return ERROR(srcSize_wrong);
  }
  /* Check if there are at least 5 training samples */
  if (nbTrainSamples < 5) {
    DISPLAYLEVEL(1, "Total number of training samples is %u and is invalid.", nbTrainSamples);
    return ERROR(srcSize_wrong);
  }
  /* Check if there's testing sample */
  if (nbTestSamples < 1) {
    DISPLAYLEVEL(1, "Total number of testing samples is %u and is invalid.", nbTestSamples);
    return ERROR(srcSize_wrong);
  }
  /* Zero the context */
  memset(ctx, 0, sizeof(*ctx));
  DISPLAYLEVEL(2, "Training on %u samples of total size %u\n", nbTrainSamples,
               (unsigned)trainingSamplesSize);
  DISPLAYLEVEL(2, "Testing on %u samples of total size %u\n", nbTestSamples,
               (unsigned)testSamplesSize);
  ctx->samples = samples;
  ctx->samplesSizes = samplesSizes;
  ctx->nbSamples = nbSamples;
  ctx->nbTrainSamples = nbTrainSamples;
  ctx->nbTestSamples = nbTestSamples;
  /* Partial suffix array */
  ctx->suffixSize = trainingSamplesSize - MAX(d, sizeof(U64)) + 1;
  ctx->suffix = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* Maps index to the dmerID */
  ctx->dmerAt = (U32 *)malloc(ctx->suffixSize * sizeof(U32));
  /* The offsets of each file */
  ctx->offsets = (size_t *)malloc((nbSamples + 1) * sizeof(size_t));
  if (!ctx->suffix || !ctx->dmerAt || !ctx->offsets) {
    DISPLAYLEVEL(1, "Failed to allocate scratch buffers\n");
    COVER_ctx_destroy(ctx);
    return ERROR(memory_allocation);
  }
  ctx->freqs = NULL;
  ctx->d = d;

  /* Fill offsets from the samplesSizes */
  {
    U32 i;
    ctx->offsets[0] = 0;
    for (i = 1; i <= nbSamples; ++i) {
      ctx->offsets[i] = ctx->offsets[i - 1] + samplesSizes[i - 1];
    }
  }
  DISPLAYLEVEL(2, "Constructing partial suffix array\n");
  {
    /* suffix is a partial suffix array.
     * It only sorts suffixes by their first parameters.d bytes.
     * The sort is stable, so each dmer group is sorted by position in input.
     */
    U32 i;
    for (i = 0; i < ctx->suffixSize; ++i) {
      ctx->suffix[i] = i;
    }
    /* qsort doesn't take an opaque pointer, so pass as a global.
     * On OpenBSD qsort() is not guaranteed to be stable, their mergesort() is.
     */
    g_coverCtx = ctx;
#if defined(__OpenBSD__)
    mergesort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#else
    qsort(ctx->suffix, ctx->suffixSize, sizeof(U32),
          (ctx->d <= 8 ? &COVER_strict_cmp8 : &COVER_strict_cmp));
#endif
  }
  DISPLAYLEVEL(2, "Computing frequencies\n");
  /* For each dmer group (group of positions with the same first d bytes):
   * 1. For each position we set dmerAt[position] = dmerID.  The dmerID is
   *    (groupBeginPtr - suffix).  This allows us to go from position to
   *    dmerID so we can look up values in freq.
   * 2. We calculate how many samples the dmer occurs in and save it in
   *    freqs[dmerId].
   */
  COVER_groupBy(ctx->suffix, ctx->suffixSize, sizeof(U32), ctx,
                (ctx->d <= 8 ? &COVER_cmp8 : &COVER_cmp), &COVER_group);
  ctx->freqs = ctx->suffix;
  ctx->suffix = NULL;
  return 0;
}